

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Create_Entity_R_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Create_Entity_R_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Create_Entity_R_PDU *this)

{
  ostream *poVar1;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Create_Entity_R_PDU *local_18;
  Create_Entity_R_PDU *this_local;
  
  local_18 = this;
  this_local = (Create_Entity_R_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Create Entity-R PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,(Simulation_Management_Header *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  Reliability_Header::GetAsString_abi_cxx11_(&local_210,&this->super_Reliability_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Request ID: ");
  poVar1 = (ostream *)
           std::ostream::operator<<(poVar1,(this->super_Create_Entity_PDU).m_ui32RequestID);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Create_Entity_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Create Entity-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << Reliability_Header::GetAsString()
       << "Request ID: " << m_ui32RequestID
       << "\n";

    return ss.str();
}